

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int hd_ringbuf_push_front(nghttp2_hd_ringbuf *ringbuf,nghttp2_hd_entry *ent,nghttp2_mem *mem)

{
  ulong uVar1;
  int rv;
  nghttp2_mem *mem_local;
  nghttp2_hd_entry *ent_local;
  nghttp2_hd_ringbuf *ringbuf_local;
  
  ringbuf_local._4_4_ = hd_ringbuf_reserve(ringbuf,ringbuf->len + 1,mem);
  if (ringbuf_local._4_4_ == 0) {
    uVar1 = ringbuf->first - 1;
    ringbuf->first = uVar1;
    ringbuf->buffer[uVar1 & ringbuf->mask] = ent;
    ringbuf->len = ringbuf->len + 1;
    ringbuf_local._4_4_ = 0;
  }
  return ringbuf_local._4_4_;
}

Assistant:

static int hd_ringbuf_push_front(nghttp2_hd_ringbuf *ringbuf,
                                 nghttp2_hd_entry *ent, nghttp2_mem *mem) {
  int rv;

  rv = hd_ringbuf_reserve(ringbuf, ringbuf->len + 1, mem);

  if (rv != 0) {
    return rv;
  }

  ringbuf->buffer[--ringbuf->first & ringbuf->mask] = ent;
  ++ringbuf->len;

  return 0;
}